

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int tjDecompressToYUV2(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,uchar *dstBuf,int width
                      ,int pad,int height,int flags)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  uint in_R9D;
  long *in_FS_OFFSET;
  int in_stack_00000008;
  uint in_stack_00000010;
  int ph1;
  int pw1;
  j_decompress_ptr dinfo;
  tjinstance *this;
  int scaledh;
  int scaledw;
  int jpegheight;
  int jpegwidth;
  int i;
  int jpegSubsamp;
  int retval;
  int strides [3];
  int ph0;
  int pw0;
  uchar *dstPlanes [3];
  int *in_stack_000001d0;
  int in_stack_000001dc;
  uchar **in_stack_000001e0;
  unsigned_long in_stack_000001e8;
  uchar *in_stack_000001f0;
  tjhandle in_stack_000001f8;
  int in_stack_00000210;
  int in_stack_00000218;
  boolean in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int local_68;
  int local_2c;
  
  if (in_RDI == 0) {
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"Invalid handle");
  }
  else {
    *(undefined4 *)(in_RDI + 0x5f8) = 0;
    *(undefined4 *)(in_RDI + 0x6d0) = 0;
    *(uint *)(in_RDI + 0x5fc) = (uint)((in_stack_00000010 & 0x2000) != 0);
    if (((((in_RSI == 0) || (in_RDX == 0)) || (in_RCX == 0)) || ((in_R8D < 0 || ((int)in_R9D < 1))))
       || (((in_R9D & in_R9D - 1) != 0 || (in_stack_00000008 < 0)))) {
      snprintf((char *)(in_RDI + 0x608),200,"%s","tjDecompressToYUV2(): Invalid argument");
      *(undefined4 *)(in_RDI + 0x6d0) = 1;
      snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s","tjDecompressToYUV2(): Invalid argument");
    }
    else {
      iVar1 = _setjmp((__jmp_buf_tag *)(in_RDI + 0x528));
      if (iVar1 != 0) {
        return -1;
      }
      jpeg_mem_src_tj((j_decompress_ptr)
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      (uchar *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      jpeg_read_header((j_decompress_ptr)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff5c);
      iVar1 = getSubsamp((j_decompress_ptr)(in_RDI + 0x208));
      if (iVar1 < 0) {
        snprintf((char *)(in_RDI + 0x608),200,"%s",
                 "tjDecompressToYUV2(): Could not determine subsampling type for JPEG image");
        *(undefined4 *)(in_RDI + 0x6d0) = 1;
        snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                 "tjDecompressToYUV2(): Could not determine subsampling type for JPEG image");
      }
      else {
        local_2c = in_R8D;
        if (in_R8D == 0) {
          local_2c = *(int *)(in_RDI + 0x238);
        }
        if (in_stack_00000008 == 0) {
          in_stack_00000008 = *(int *)(in_RDI + 0x23c);
        }
        local_68 = 0;
        while ((local_68 < 0x10 &&
               ((local_2c <
                 (*(int *)(in_RDI + 0x238) * sf[local_68].num + sf[local_68].denom + -1) /
                 sf[local_68].denom ||
                (in_stack_00000008 <
                 (*(int *)(in_RDI + 0x23c) * sf[local_68].num + sf[local_68].denom + -1) /
                 sf[local_68].denom))))) {
          local_68 = local_68 + 1;
        }
        if (local_68 < 0x10) {
          tjPlaneWidth(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c
                      );
          tjPlaneHeight(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                        in_stack_ffffffffffffff6c);
          if (iVar1 != 3) {
            iVar1 = tjPlaneWidth(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                                 in_stack_ffffffffffffff6c);
            tjPlaneHeight(iVar1,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
          }
          *(undefined4 *)(in_RDI + 0x604) = 1;
          iVar1 = tjDecompressToYUVPlanes
                            (in_stack_000001f8,in_stack_000001f0,in_stack_000001e8,in_stack_000001e0
                             ,in_stack_000001dc,in_stack_000001d0,in_stack_00000210,
                             in_stack_00000218);
          return iVar1;
        }
        snprintf((char *)(in_RDI + 0x608),200,"%s",
                 "tjDecompressToYUV2(): Could not scale down to desired image dimensions");
        *(undefined4 *)(in_RDI + 0x6d0) = 1;
        snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s",
                 "tjDecompressToYUV2(): Could not scale down to desired image dimensions");
      }
    }
    *(undefined4 *)(in_RDI + 0x5fc) = 0;
  }
  return -1;
}

Assistant:

DLLEXPORT int tjDecompressToYUV2(tjhandle handle, const unsigned char *jpegBuf,
                                 unsigned long jpegSize, unsigned char *dstBuf,
                                 int width, int pad, int height, int flags)
{
  unsigned char *dstPlanes[3];
  int pw0, ph0, strides[3], retval = -1, jpegSubsamp = -1;
  int i, jpegwidth, jpegheight, scaledw, scaledh;

  GET_DINSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;

  if (jpegBuf == NULL || jpegSize <= 0 || dstBuf == NULL || width < 0 ||
      pad < 1 || !IS_POW2(pad) || height < 0)
    THROW("tjDecompressToYUV2(): Invalid argument");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    return -1;
  }

  jpeg_mem_src_tj(dinfo, jpegBuf, jpegSize);
  jpeg_read_header(dinfo, TRUE);
  jpegSubsamp = getSubsamp(dinfo);
  if (jpegSubsamp < 0)
    THROW("tjDecompressToYUV2(): Could not determine subsampling type for JPEG image");

  jpegwidth = dinfo->image_width;  jpegheight = dinfo->image_height;
  if (width == 0) width = jpegwidth;
  if (height == 0) height = jpegheight;

  for (i = 0; i < NUMSF; i++) {
    scaledw = TJSCALED(jpegwidth, sf[i]);
    scaledh = TJSCALED(jpegheight, sf[i]);
    if (scaledw <= width && scaledh <= height)
      break;
  }
  if (i >= NUMSF)
    THROW("tjDecompressToYUV2(): Could not scale down to desired image dimensions");

  pw0 = tjPlaneWidth(0, width, jpegSubsamp);
  ph0 = tjPlaneHeight(0, height, jpegSubsamp);
  dstPlanes[0] = dstBuf;
  strides[0] = PAD(pw0, pad);
  if (jpegSubsamp == TJSAMP_GRAY) {
    strides[1] = strides[2] = 0;
    dstPlanes[1] = dstPlanes[2] = NULL;
  } else {
    int pw1 = tjPlaneWidth(1, width, jpegSubsamp);
    int ph1 = tjPlaneHeight(1, height, jpegSubsamp);

    strides[1] = strides[2] = PAD(pw1, pad);
    dstPlanes[1] = dstPlanes[0] + strides[0] * ph0;
    dstPlanes[2] = dstPlanes[1] + strides[1] * ph1;
  }

  this->headerRead = 1;
  return tjDecompressToYUVPlanes(handle, jpegBuf, jpegSize, dstPlanes, width,
                                 strides, height, flags);

bailout:
  this->jerr.stopOnWarning = FALSE;
  return retval;
}